

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film.h
# Opt level: O2

void __thiscall pbrt::GBufferFilm::Pixel::Pixel(Pixel *this)

{
  long lVar1;
  undefined1 auVar2 [32];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar3 [64];
  
  lVar1 = 0;
  this->rgbSum[0] = 0.0;
  this->rgbSum[1] = 0.0;
  this->rgbSum[2] = 0.0;
  this->weightSum = 0.0;
  do {
    LOCK();
    *(undefined8 *)((long)&this->splatRGB[0].bits.super___atomic_base<unsigned_long>._M_i + lVar1) =
         0;
    UNLOCK();
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x18);
  auVar2 = ZEXT432(0) << 0x40;
  this->dzdxSum = (Float)auVar2._0_4_;
  this->dzdySum = (Float)auVar2._4_4_;
  this->nSum = (Normal3f)auVar2._8_12_;
  this->nsSum = (Normal3f)auVar2._20_12_;
  this->pSum = (Point3f)auVar2._0_12_;
  this->dzdxSum = (Float)auVar2._12_4_;
  this->dzdySum = (Float)auVar2._16_4_;
  this->nSum = (Normal3f)auVar2._20_12_;
  this->varianceEstimator[2].n = 0;
  auVar3 = ZEXT464(0) << 0x40;
  auVar4 = auVar3._24_16_;
  auVar5 = auVar3._40_16_;
  this->albedoSum[0] = (double)auVar3._0_8_;
  this->albedoSum[1] = (double)auVar3._8_8_;
  this->albedoSum[2] = (double)auVar3._16_8_;
  this->varianceEstimator[0].mean = (float)auVar4._0_4_;
  this->varianceEstimator[0].S = (float)auVar4._4_4_;
  this->varianceEstimator[0].n = auVar4._8_8_;
  this->varianceEstimator[1].mean = (float)auVar5._0_4_;
  this->varianceEstimator[1].S = (float)auVar5._4_4_;
  this->varianceEstimator[1].n = auVar5._8_8_;
  this->varianceEstimator[2].mean = (float)auVar3._56_4_;
  this->varianceEstimator[2].S = (float)auVar3._60_4_;
  return;
}

Assistant:

Pixel() = default;